

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O2

int rtr_send_serial_query(rtr_socket *rtr_socket)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  pdu_serial_query pdu;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pdu.ver = (uint8_t)rtr_socket->version;
  pdu.type = '\x01';
  pdu.session_id = (uint16_t)rtr_socket->session_id;
  pdu.len = 0xc;
  pdu.sn = rtr_socket->serial_number;
  iVar3 = 0;
  lrtr_dbg("RTR Socket: sending serial query, SN: %u");
  iVar2 = rtr_send_pdu(rtr_socket,&pdu,0xc);
  if (iVar2 != 0) {
    rtr_change_socket_state(rtr_socket,RTR_ERROR_TRANSPORT);
    iVar3 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_send_serial_query(struct rtr_socket *rtr_socket)
{
	struct pdu_serial_query pdu;

	pdu.ver = rtr_socket->version;
	pdu.type = SERIAL_QUERY;
	pdu.session_id = rtr_socket->session_id;
	pdu.len = sizeof(pdu);
	pdu.sn = rtr_socket->serial_number;

	RTR_DBG("sending serial query, SN: %u", rtr_socket->serial_number);
	if (rtr_send_pdu(rtr_socket, &pdu, sizeof(pdu)) != RTR_SUCCESS) {
		rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
		return RTR_ERROR;
	}
	return RTR_SUCCESS;
}